

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_time.c
# Opt level: O0

int equal_stop_time(stop_time_t *a,stop_time_t *b)

{
  int iVar1;
  bool local_19;
  stop_time_t *b_local;
  stop_time_t *a_local;
  
  iVar1 = strcmp(a->trip_id,b->trip_id);
  local_19 = false;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->arrival_time,b->arrival_time);
    local_19 = false;
    if (iVar1 == 0) {
      iVar1 = strcmp(a->departure_time,b->departure_time);
      local_19 = false;
      if (iVar1 == 0) {
        iVar1 = strcmp(a->stop_id,b->stop_id);
        local_19 = false;
        if (iVar1 == 0) {
          iVar1 = strcmp(a->stop_headsign,b->stop_headsign);
          local_19 = false;
          if ((((iVar1 == 0) && (local_19 = false, a->stop_sequence == b->stop_sequence)) &&
              (local_19 = false, a->pickup_type == b->pickup_type)) &&
             (local_19 = false, a->dropoff_type == b->dropoff_type)) {
            local_19 = false;
            if ((a->shape_dist_traveled == b->shape_dist_traveled) &&
               (!NAN(a->shape_dist_traveled) && !NAN(b->shape_dist_traveled))) {
              local_19 = a->timepoint == b->timepoint;
            }
          }
        }
      }
    }
  }
  return (int)local_19;
}

Assistant:

int equal_stop_time(const stop_time_t *a, const stop_time_t *b) {
    return (!strcmp(a->trip_id, b->trip_id) &&
             !strcmp(a->arrival_time, b->arrival_time) &&
             !strcmp(a->departure_time, b->departure_time) &&
             !strcmp(a->stop_id, b->stop_id) &&
             !strcmp(a->stop_headsign, b->stop_headsign) &&
             a->stop_sequence == b->stop_sequence &&
             a->pickup_type == b->pickup_type &&
             a->dropoff_type == b->dropoff_type &&
             a->shape_dist_traveled == b->shape_dist_traveled &&
             a->timepoint == b->timepoint);
}